

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O3

void tommy_tree_foreach_arg_node(tommy_tree_node *root,tommy_foreach_arg_func *func,void *arg)

{
  long lVar1;
  tommy_node_struct *ptVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (root != (tommy_tree_node *)0x0) {
    do {
      tommy_tree_foreach_arg_node(root->prev,func,arg);
      ptVar2 = root->next;
      (*func)(arg,root->data);
      root = ptVar2;
    } while (ptVar2 != (tommy_node_struct *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void tommy_tree_foreach_arg_node(tommy_tree_node* root, tommy_foreach_arg_func* func, void* arg)
{
	tommy_tree_node* next;

	if (!root)
		return;

	tommy_tree_foreach_arg_node(root->prev, func, arg);

	/* make a copy in case func is free() */
	next = root->next;

	func(arg, root->data);

	tommy_tree_foreach_arg_node(next, func, arg);
}